

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall Js::PolymorphicInlineCache::Dump(PolymorphicInlineCache *this)

{
  bool bVar1;
  uint local_14;
  uint i;
  PolymorphicInlineCache *this_local;
  
  for (local_14 = 0; local_14 < this->size; local_14 = local_14 + 1) {
    bVar1 = InlineCache::IsEmpty(this->inlineCaches + local_14);
    if (!bVar1) {
      Output::Print(L"  %d: ",(ulong)local_14);
      InlineCache::Dump(this->inlineCaches + local_14);
      Output::Print(L"\n");
    }
  }
  return;
}

Assistant:

void PolymorphicInlineCache::Dump()
    {
        for (uint i = 0; i < size; ++i)
        {
            if (!inlineCaches[i].IsEmpty())
            {
                Output::Print(_u("  %d: "), i);
                inlineCaches[i].Dump();
                Output::Print(_u("\n"));
            }
        }
    }